

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Cluster::GetNext(Cluster *this,BlockEntry *pCurr,BlockEntry **pNext)

{
  ulong uVar1;
  BlockEntry *pBVar2;
  bool bVar3;
  ulong uVar4;
  long len;
  longlong pos;
  long local_30;
  longlong local_28;
  
  if (pCurr == (BlockEntry *)0x0) {
    __assert_fail("pCurr",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1ce9,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  if (this->m_entries == (BlockEntry **)0x0) {
    __assert_fail("m_entries",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cea,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  uVar4 = this->m_entries_count;
  if ((long)uVar4 < 1) {
    __assert_fail("m_entries_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1ceb,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  uVar1 = pCurr->m_index;
  if (uVar4 <= uVar1) {
    __assert_fail("idx < size_t(m_entries_count)",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cee,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  if (this->m_entries[uVar1] != pCurr) {
    __assert_fail("m_entries[idx] == pCurr",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cef,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  if (uVar1 + 1 < uVar4) goto LAB_0012c3f9;
  uVar4 = Parse(this,&local_28,&local_30);
  if ((long)uVar4 < 0) {
LAB_0012c3c7:
    *pNext = (BlockEntry *)0x0;
    bVar3 = false;
  }
  else {
    if (uVar4 != 0) {
      uVar4 = 0;
      goto LAB_0012c3c7;
    }
    if (this->m_entries == (BlockEntry **)0x0) {
      __assert_fail("m_entries",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d03,
                    "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const"
                   );
    }
    uVar4 = this->m_entries_count;
    if ((long)uVar4 < 1) {
      __assert_fail("m_entries_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d04,
                    "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const"
                   );
    }
    if (uVar4 <= uVar1 + 1) {
      __assert_fail("idx < size_t(m_entries_count)",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d05,
                    "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const"
                   );
    }
    bVar3 = true;
  }
  if (!bVar3) {
    return uVar4;
  }
LAB_0012c3f9:
  pBVar2 = this->m_entries[uVar1 + 1];
  *pNext = pBVar2;
  if (pBVar2 != (BlockEntry *)0x0) {
    return 0;
  }
  __assert_fail("pNext",
                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1d09,
                "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const");
}

Assistant:

long Cluster::GetNext(const BlockEntry* pCurr, const BlockEntry*& pNext) const {
  assert(pCurr);
  assert(m_entries);
  assert(m_entries_count > 0);

  size_t idx = pCurr->GetIndex();
  assert(idx < size_t(m_entries_count));
  assert(m_entries[idx] == pCurr);

  ++idx;

  if (idx >= size_t(m_entries_count)) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pNext = NULL;
      return status;
    }

    if (status > 0) {
      pNext = NULL;
      return 0;
    }

    assert(m_entries);
    assert(m_entries_count > 0);
    assert(idx < size_t(m_entries_count));
  }

  pNext = m_entries[idx];
  assert(pNext);

  return 0;
}